

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapObjects.cpp
# Opt level: O2

void TTD::NSSnapObjects::ParseAddtlInfo_SnapPromiseAllResolveElementFunctionInfo
               (SnapObject *snpObject,FileReader *reader,SlabAllocator *alloc)

{
  uint32 uVar1;
  int iVar2;
  SnapPromiseAllResolveElementFunctionInfo *addtlInfo;
  TTD_PTR_ID TVar3;
  
  addtlInfo = (SnapPromiseAllResolveElementFunctionInfo *)
              SlabAllocatorBase<0>::SlabAllocateTypeRawSize<72ul>(alloc);
  (*reader->_vptr_FileReader[3])(reader,3,1);
  NSSnapValues::ParsePromiseCapabilityInfo
            ((SnapPromiseCapabilityInfo *)addtlInfo,false,reader,alloc);
  uVar1 = FileReader::ReadUInt32(reader,u32Val,true);
  addtlInfo->Index = uVar1;
  TVar3 = FileReader::ReadAddr(reader,ptrIdVal,true);
  addtlInfo->RemainingElementsWrapperId = TVar3;
  uVar1 = FileReader::ReadUInt32(reader,u32Val,true);
  addtlInfo->RemainingElementsValue = uVar1;
  TVar3 = FileReader::ReadAddr(reader,ptrIdVal,true);
  addtlInfo->Values = TVar3;
  iVar2 = (*reader->_vptr_FileReader[10])(reader,10,1);
  addtlInfo->AlreadyCalled = SUB41(iVar2,0);
  SnapObjectSetAddtlInfoAs<TTD::NSSnapObjects::SnapPromiseAllResolveElementFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)31>
            (snpObject,addtlInfo);
  return;
}

Assistant:

void ParseAddtlInfo_SnapPromiseAllResolveElementFunctionInfo(SnapObject* snpObject, FileReader* reader, SlabAllocator& alloc)
        {
            SnapPromiseAllResolveElementFunctionInfo* aInfo = alloc.SlabAllocateStruct<SnapPromiseAllResolveElementFunctionInfo>();

            reader->ReadKey(NSTokens::Key::entry, true);
            NSSnapValues::ParsePromiseCapabilityInfo(&aInfo->Capabilities, false, reader, alloc);

            aInfo->Index = reader->ReadUInt32(NSTokens::Key::u32Val, true);
            aInfo->RemainingElementsWrapperId = reader->ReadAddr(NSTokens::Key::ptrIdVal, true);
            aInfo->RemainingElementsValue = reader->ReadUInt32(NSTokens::Key::u32Val, true);

            aInfo->Values = reader->ReadAddr(NSTokens::Key::ptrIdVal, true);

            aInfo->AlreadyCalled = reader->ReadBool(NSTokens::Key::boolVal, true);

            SnapObjectSetAddtlInfoAs<SnapPromiseAllResolveElementFunctionInfo*, SnapObjectType::SnapPromiseAllResolveElementFunctionObject>(snpObject, aInfo);
        }